

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramsurface.hpp
# Opt level: O1

void __thiscall ParamSurface::buildmesh(ParamSurface *this)

{
  undefined8 uVar1;
  vec2f vt1;
  vec2f vt2;
  vec2f vt3;
  vec2f vt3_00;
  vec2f vt2_00;
  vec2f vt1_00;
  Triangle *pTVar2;
  long lVar3;
  BasicContainer *this_00;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar4;
  float fVar5;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  vec3f v1;
  vec3f v1_00;
  vec3f v2;
  vec3f v2_00;
  vec3f v3;
  vec3f v3_00;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> trigs;
  Triangle *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  float local_168;
  float fStack_164;
  float local_160;
  float fStack_15c;
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_148;
  undefined4 local_140;
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_128;
  undefined4 local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined8 local_108;
  undefined4 local_100;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  float fStack_e4;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  float fStack_c4;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  float local_98;
  float fStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar12 = 0.0;
  uStack_174 = 0;
  uStack_170 = 0;
  uStack_16c = 0;
  do {
    local_f8 = fVar12 + 0.01;
    fVar5 = 0.0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    local_178 = fVar12;
    uStack_f4 = uStack_174;
    uStack_f0 = uStack_170;
    uStack_ec = uStack_16c;
    do {
      local_a8 = 0;
      local_a0 = 0;
      local_b8 = 0;
      local_b0 = 0;
      local_188 = fVar5;
      fStack_184 = (float)uVar9;
      fStack_180 = (float)uVar10;
      fStack_17c = (float)uVar11;
      (*(this->super_Primitive)._vptr_Primitive[3])(local_178,this,&local_a8,&local_b8);
      fVar6 = local_188 + 0.01;
      uStack_d4 = fStack_184;
      uStack_d0 = fStack_180;
      uStack_cc = fStack_17c;
      local_d8 = fVar6;
      local_78 = extraout_XMM0_Da;
      fStack_74 = extraout_XMM0_Db;
      (*(this->super_Primitive)._vptr_Primitive[3])(local_178,this,&local_a8,&local_b8);
      fVar12 = local_188;
      local_c8 = extraout_XMM0_Da_00;
      fStack_c4 = extraout_XMM0_Db_00;
      (*(this->super_Primitive)._vptr_Primitive[3])(local_f8,this,&local_a8,&local_b8);
      fVar7 = local_d8;
      local_e8 = extraout_XMM0_Da_01;
      fStack_e4 = extraout_XMM0_Db_01;
      (*(this->super_Primitive)._vptr_Primitive[3])(local_f8,this,&local_a8,&local_b8);
      local_48 = fStack_c4;
      fStack_44 = fStack_c4;
      fStack_40 = fStack_c4;
      fStack_3c = fStack_c4;
      local_58 = fStack_e4;
      fStack_54 = fStack_e4;
      fStack_50 = fStack_e4;
      fStack_4c = fStack_e4;
      fVar8 = (fStack_74 - fStack_c4) * (fVar5 - fVar12) - (fStack_74 - fStack_e4) * (fVar5 - fVar6)
      ;
      fVar13 = (fVar5 - fVar6) * (local_78 - local_e8) - (fVar5 - fVar12) * (local_78 - local_c8);
      fVar4 = (fStack_74 - fStack_e4) * (local_78 - local_c8) -
              (local_78 - local_e8) * (fStack_74 - fStack_c4);
      local_68 = fVar4 * fVar4 + fVar8 * fVar8 + fVar13 * fVar13;
      fStack_64 = fStack_74;
      fStack_60 = fStack_74;
      fStack_5c = fStack_74;
      local_88 = extraout_XMM0_Da_02;
      fStack_84 = extraout_XMM0_Db_02;
      if (local_68 < 0.0) {
        fVar4 = sqrtf(local_68);
      }
      else {
        fVar4 = SQRT(local_68);
      }
      local_98 = local_f8;
      fStack_94 = local_188;
      uStack_90 = uStack_f0;
      uStack_8c = uStack_ec;
      if (1e-12 < fVar4) {
        pTVar2 = (Triangle *)operator_new(0xa0);
        local_160 = local_178;
        fStack_15c = local_d8;
        local_108 = 0;
        local_100 = 0;
        local_118 = 0;
        local_110 = 0;
        local_128 = 0;
        local_120 = 0;
        vt3_00.y = local_d8;
        vt3_00.x = local_178;
        v1.y = fStack_74;
        v1.x = local_78;
        v2.y = fStack_e4;
        v2.x = local_e8;
        v3.y = fStack_c4;
        v3.x = local_c8;
        vt2_00.y = fStack_94;
        vt2_00.x = local_98;
        v1.z = fVar5;
        v2.z = fVar12;
        v3.z = fVar6;
        vt1.y = local_188;
        vt1.x = local_178;
        Triangle::Triangle(pTVar2,v1,v2,v3,vt1,vt2_00,vt3_00,(vec3f)(ZEXT412(0) << 0x40),
                           (vec3f)(ZEXT412(0) << 0x40),(vec3f)(ZEXT412(0) << 0x40));
        local_190 = pTVar2;
        if (trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
          _M_realloc_insert<BasicPrimitive*>
                    ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&trigs,
                     (iterator)
                     trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(BasicPrimitive **)&local_190);
        }
        else {
          *trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (BasicPrimitive *)pTVar2;
          trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
      }
      if (local_68 < 0.0) {
        fVar5 = sqrtf(local_68);
      }
      else {
        fVar5 = SQRT(local_68);
      }
      if (1e-12 < fVar5) {
        lVar3 = __dynamic_cast(trigs.
                               super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1],
                               &BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
        uVar1 = *(undefined8 *)(lVar3 + 0x8c);
        *(undefined8 *)(lVar3 + 0x44) = uVar1;
        uVar9 = *(undefined4 *)(lVar3 + 0x94);
        *(undefined4 *)(lVar3 + 0x4c) = uVar9;
        *(undefined8 *)(lVar3 + 0x38) = uVar1;
        *(undefined4 *)(lVar3 + 0x40) = uVar9;
        *(undefined8 *)(lVar3 + 0x2c) = uVar1;
        *(undefined4 *)(lVar3 + 0x34) = uVar9;
      }
      fVar4 = (fStack_84 - local_48) * (fVar7 - fVar12) - (fStack_84 - local_58) * (fVar7 - fVar6);
      fVar8 = (fVar7 - fVar6) * (local_88 - local_e8) - (fVar7 - fVar12) * (local_88 - local_c8);
      fVar5 = (fStack_84 - local_58) * (local_88 - local_c8) -
              (local_88 - local_e8) * (fStack_84 - local_48);
      local_188 = fVar5 * fVar5 + fVar4 * fVar4 + fVar8 * fVar8;
      fStack_184 = fStack_84;
      fStack_180 = fStack_84;
      fStack_17c = fStack_84;
      if (local_188 < 0.0) {
        fVar5 = sqrtf(local_188);
      }
      else {
        fVar5 = SQRT(local_188);
      }
      if (1e-12 < fVar5) {
        pTVar2 = (Triangle *)operator_new(0xa0);
        local_168 = local_178;
        fStack_164 = local_d8;
        local_138 = 0;
        local_130 = 0;
        local_148 = 0;
        local_140 = 0;
        local_158 = 0;
        local_150 = 0;
        vt3.y = local_d8;
        vt3.x = local_178;
        v1_00.y = fStack_e4;
        v1_00.x = local_e8;
        v2_00.y = fStack_84;
        v2_00.x = local_88;
        v3_00.y = fStack_c4;
        v3_00.x = local_c8;
        vt1_00.y = fStack_94;
        vt1_00.x = local_98;
        v1_00.z = fVar12;
        v2_00.z = fVar7;
        v3_00.z = fVar6;
        vt2.y = local_d8;
        vt2.x = local_f8;
        Triangle::Triangle(pTVar2,v1_00,v2_00,v3_00,vt1_00,vt2,vt3,(vec3f)(ZEXT412(0) << 0x40),
                           (vec3f)(ZEXT412(0) << 0x40),(vec3f)(ZEXT412(0) << 0x40));
        local_190 = pTVar2;
        if (trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
          _M_realloc_insert<BasicPrimitive*>
                    ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&trigs,
                     (iterator)
                     trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(BasicPrimitive **)&local_190);
        }
        else {
          *trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (BasicPrimitive *)pTVar2;
          trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
      }
      if (local_188 < 0.0) {
        fVar12 = sqrtf(local_188);
      }
      else {
        fVar12 = SQRT(local_188);
      }
      if (1e-12 < fVar12) {
        lVar3 = __dynamic_cast(trigs.
                               super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1],
                               &BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
        uVar1 = *(undefined8 *)(lVar3 + 0x8c);
        *(undefined8 *)(lVar3 + 0x44) = uVar1;
        uVar9 = *(undefined4 *)(lVar3 + 0x94);
        *(undefined4 *)(lVar3 + 0x4c) = uVar9;
        *(undefined8 *)(lVar3 + 0x38) = uVar1;
        *(undefined4 *)(lVar3 + 0x40) = uVar9;
        *(undefined8 *)(lVar3 + 0x2c) = uVar1;
        *(undefined4 *)(lVar3 + 0x34) = uVar9;
      }
      fVar5 = local_d8;
      uVar9 = uStack_d4;
      uVar10 = uStack_d0;
      uVar11 = uStack_cc;
    } while (local_d8 + 0.005 < 1.0);
    fVar12 = local_178 + 0.01;
  } while (fVar12 + 0.005 < 1.0);
  this_00 = (BasicContainer *)operator_new(0x40);
  BasicContainer::BasicContainer(this_00,&trigs);
  this->mesh = this_00;
  if (trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(trigs.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)trigs.
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)trigs.
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void buildmesh()
	{
		// build approximating mesh
		float step = 0.01;
		std::vector<BasicPrimitive*> trigs;
		for (float i=0; i+step/2<1; i+=step)
			for (float j=0; j+step/2<1; j+=step)
			{
				vec3f t1,t2,t; // dummy vars
				vec3f p00 = surface(i,j,t1,t2);
				vec3f p01 = surface(i,j+step,t1,t2);
				vec3f p10 = surface(i+step,j,t1,t2);
				vec3f p11 = surface(i+step,j+step,t1,t2);
				vec2f u00 = vec2f(i,j);
				vec2f u01 = vec2f(i,j+step);
				vec2f u10 = vec2f(i+step,j);
				vec2f u11 = vec2f(i+step,j+step);
				if (norm(cross(p00-p01,p00-p10)) > 1e-12)
				trigs.push_back(new Triangle(p00,p10,p01,u00,u10,u01,t,t,t));
				if (norm(cross(p00-p01,p00-p10)) > 1e-12)
				dynamic_cast<Triangle*>(trigs.back())->recompute_normal();
				if (norm(cross(p11-p01,p11-p10)) > 1e-12)
				trigs.push_back(new Triangle(p10,p11,p01,u10,u11,u01,t,t,t));
				if (norm(cross(p11-p01,p11-p10)) > 1e-12)
				dynamic_cast<Triangle*>(trigs.back())->recompute_normal();
			}
		mesh = new BasicContainer(trigs);
	}